

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlReportText.cpp
# Opt level: O0

string * __thiscall
oout::FmtJunitXml::test
          (string *__return_storage_ptr__,FmtJunitXml *this,string *name,
          shared_ptr<const_oout::Result> *assertion_result,nanoseconds *duration)

{
  ostream *poVar1;
  element_type *peVar2;
  string local_1e0 [48];
  ostringstream local_1b0 [8];
  ostringstream out;
  duration<float,_std::ratio<1L,_1L>_> local_38;
  rep_conflict local_34;
  nanoseconds *pnStack_30;
  rep_conflict time;
  nanoseconds *duration_local;
  shared_ptr<const_oout::Result> *assertion_result_local;
  string *name_local;
  FmtJunitXml *this_local;
  
  pnStack_30 = duration;
  duration_local = (nanoseconds *)assertion_result;
  assertion_result_local = (shared_ptr<const_oout::Result> *)name;
  name_local = (string *)this;
  this_local = (FmtJunitXml *)__return_storage_ptr__;
  local_38.__r = (rep_conflict)
                 std::chrono::
                 duration_cast<std::chrono::duration<float,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                           (duration);
  local_34 = std::chrono::duration<float,_std::ratio<1L,_1L>_>::count(&local_38);
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  poVar1 = std::operator<<((ostream *)local_1b0,"<testcase ");
  poVar1 = std::operator<<(poVar1,"name=\'");
  poVar1 = std::operator<<(poVar1,(string *)assertion_result_local);
  poVar1 = std::operator<<(poVar1,"\' ");
  poVar1 = std::operator<<(poVar1,"time=\'");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_34);
  poVar1 = std::operator<<(poVar1,"\'>");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  peVar2 = std::__shared_ptr_access<const_oout::Result,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_oout::Result,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)duration_local);
  (*peVar2->_vptr_Result[2])(local_1e0,peVar2,this);
  poVar1 = std::operator<<(poVar1,local_1e0);
  poVar1 = std::operator<<(poVar1,"</testcase>");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

string test(
		const string &name,
		const shared_ptr<const Result> &assertion_result,
		const chrono::nanoseconds &duration
	) const override
	{
		const auto time = chrono::duration_cast<chrono::duration<float>>(duration).count();
		ostringstream out;
		out << "<testcase "
		    << "name='" << name << "' "
		    << "time='" << time << "'>" << endl
		    << assertion_result->print(*this)
		    << "</testcase>" << endl;
		return out.str();
	}